

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O3

err_t btokVerify(void *buf,size_t count,octet *sig,octet *pubkey,size_t pubkey_len)

{
  octet *pubkey_00;
  err_t eVar1;
  size_t sVar2;
  octet *poVar3;
  char *oid;
  ulong privkey_len;
  octet *hash;
  size_t oid_len;
  octet oid_der [16];
  bign_params params [1];
  size_t local_1b0;
  octet *local_1a8;
  octet *local_1a0;
  octet local_198 [16];
  bign_params local_188;
  
  local_1b0 = 0x10;
  if ((pubkey_len & 1) != 0) {
    return 0x6d;
  }
  privkey_len = pubkey_len >> 1;
  btokParamsStd(&local_188,privkey_len);
  local_1a8 = sig;
  local_1a0 = pubkey;
  if (pubkey_len < 0x41) {
    sVar2 = beltHash_keep();
    poVar3 = (octet *)blobCreate(sVar2 + privkey_len);
    if (poVar3 == (octet *)0x0) {
      return 0x6e;
    }
    hash = poVar3 + privkey_len;
    beltHashStart(hash);
    beltHashStepH(buf,count,hash);
    beltHashStepG2(poVar3,privkey_len,hash);
    eVar1 = bignOidToDER(local_198,&local_1b0,"1.2.112.0.2.0.34.101.31.81");
    pubkey_00 = local_1a0;
    if (eVar1 != 0) goto LAB_001272e3;
    if (pubkey_len == 0x30) {
      eVar1 = bign96PubkeyVal(&local_188,local_1a0);
      hash = poVar3;
      if (eVar1 == 0) {
        eVar1 = bign96Verify(&local_188,local_198,local_1b0,poVar3,local_1a8,pubkey_00);
      }
      goto LAB_001272e3;
    }
  }
  else {
    sVar2 = bashHash_keep();
    poVar3 = (octet *)blobCreate(sVar2 + privkey_len);
    if (poVar3 == (octet *)0x0) {
      return 0x6e;
    }
    hash = poVar3 + privkey_len;
    bashHashStart(hash,pubkey_len * 2);
    bashHashStepH(buf,count,hash);
    bashHashStepG(poVar3,privkey_len,hash);
    oid = "1.2.112.0.2.0.34.101.77.13";
    if (pubkey_len == 0x60) {
      oid = "1.2.112.0.2.0.34.101.77.12";
    }
    eVar1 = bignOidToDER(local_198,&local_1b0,oid);
    if (eVar1 != 0) goto LAB_001272e3;
  }
  hash = poVar3;
  poVar3 = local_1a0;
  eVar1 = bignPubkeyVal(&local_188,local_1a0);
  if (eVar1 == 0) {
    eVar1 = bignVerify(&local_188,local_198,local_1b0,hash,local_1a8,poVar3);
  }
LAB_001272e3:
  blobClose(hash);
  return eVar1;
}

Assistant:

static err_t btokVerify(const void* buf, size_t count, const octet sig[],
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	void* stack;
	octet* hash;
	void* state;
	// входной контроль
	if (pubkey_len % 2)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = btokParamsStd(params, pubkey_len / 2);
	// создать и разметить стек
	stack = blobCreate(pubkey_len / 2 +
		(pubkey_len <= 64 ? beltHash_keep() : bashHash_keep()));
	if (!stack)
		return ERR_OUTOFMEMORY;
	hash = (octet*)stack;
	state = hash + pubkey_len / 2;
   	// хэшировать
	if (pubkey_len <= 64)
	{
		beltHashStart(state);
		beltHashStepH(buf, count, state);
		beltHashStepG2(hash, pubkey_len / 2, state);
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, blobClose(state));
		ASSERT(oid_len == 11);
	}
	else
	{
		bashHashStart(state, pubkey_len * 2);
		bashHashStepH(buf, count, state);
		bashHashStepG(hash, pubkey_len / 2, state);
		code = bignOidToDER(oid_der, &oid_len, pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, blobClose(state));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (pubkey_len == 48)
		code = bign96PubkeyVal(params, pubkey);
	else
		code = bignPubkeyVal(params, pubkey);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить подпись
	if (pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig, pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig, pubkey);
	// завершить
	blobClose(stack);
	return code;
}